

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaos.c
# Opt level: O2

void chaos_mode(dw_rom *rom)

{
  uint8_t *puVar1;
  float *pfVar2;
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  long lVar8;
  BOOL consistent;
  uint16_t *__base;
  long lVar9;
  dw_enemy *pdVar10;
  long lVar11;
  int iVar12;
  float fVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double local_2b0;
  double local_298;
  ushort auStack_28a [301];
  
  bVar5 = rom->flags[5];
  if ((bVar5 & 0xc) != 0) {
    consistent = rom->flags[6] & 0xffffffc0;
    pdVar10 = rom->enemies;
    for (lVar9 = 0; lVar9 != 0x260; lVar9 = lVar9 + 0x10) {
      dVar17 = mt_rand_double_ranged(1.0,40.0);
      dVar17 = (double)(float)dVar17;
      dVar14 = 4.0;
      local_298 = dVar17;
      dVar16 = pow(dVar17,4.0);
      dVar17 = polyfit(dVar17,&mon_hp_fac);
      (&pdVar10->hp)[lVar9] = (uint8_t)(int)dVar17;
      dVar17 = next_rank(consistent,&local_298,1.0,dVar14);
      dVar15 = 4.0;
      dVar17 = pow(dVar17,4.0);
      dVar14 = polyfit(local_298,&mon_str_fac);
      (&pdVar10->str)[lVar9] = (uint8_t)(int)dVar14;
      dVar14 = next_rank(consistent,&local_298,1.0,dVar15);
      dVar14 = pow(dVar14,4.0);
      dVar15 = polyfit(local_298,&mon_agi_fac);
      (&pdVar10->agi)[lVar9] = (uint8_t)(int)dVar15;
      dVar15 = mt_rand_double_ranged(1.0,40.0);
      local_2b0 = pow((double)(float)dVar15 / 3.0,4.0);
      local_2b0 = local_2b0 + dVar14 + dVar17 + dVar16;
      dVar17 = polyfit((double)(float)dVar15,&mon_sr_fac);
      (&pdVar10->s_ss_resist)[lVar9] = (char)(int)dVar17 << 4;
      if ((&pdVar10->pattern)[lVar9] != '\0') {
        dVar17 = mt_rand_double_ranged(1.0,40.0);
        dVar16 = pow((double)(float)dVar17 / 3.0,4.0);
        local_2b0 = local_2b0 + dVar16;
        dVar17 = polyfit((double)(float)dVar17,&mon_ssr_fac);
        (&pdVar10->s_ss_resist)[lVar9] = (&pdVar10->s_ss_resist)[lVar9] | (byte)(int)dVar17;
      }
      dVar17 = mt_rand_double_ranged(1.0,40.0);
      dVar16 = pow((double)(float)dVar17 / 3.0,4.0);
      dVar17 = polyfit((double)(float)dVar17,&mon_hr_fac);
      (&pdVar10->hr_dodge)[lVar9] = (char)(int)dVar17 << 4;
      dVar17 = mt_rand_double_ranged(1.0,40.0);
      local_298 = (double)(float)dVar17;
      dVar17 = polyfit(local_298,&mon_dodge_fac);
      (&pdVar10->hr_dodge)[lVar9] = (&pdVar10->hr_dodge)[lVar9] | (byte)(int)dVar17;
      if ((&pdVar10->pattern)[lVar9] == '\0') {
        (&pdVar10->s_ss_resist)[lVar9] = (&pdVar10->s_ss_resist)[lVar9] | 0xf;
      }
      local_2b0 = local_2b0 + dVar16;
      if (local_2b0 < 0.0) {
        local_2b0 = sqrt(local_2b0);
      }
      else {
        local_2b0 = SQRT(local_2b0);
      }
      if (local_2b0 < 0.0) {
        local_2b0 = sqrt(local_2b0);
      }
      else {
        local_2b0 = SQRT(local_2b0);
      }
      *(float *)((long)&pdVar10->rank + lVar9) = (float)(local_2b0 * 0.75);
    }
    dVar16 = 40.0;
    dVar17 = mt_rand_double_ranged(28.0,40.0);
    local_298 = (double)(float)dVar17;
    dVar17 = polyfit(local_298,&mon_hp_fac);
    pdVar10[0x26].hp = (uint8_t)(int)dVar17;
    next_rank(consistent,&local_298,28.0,dVar16);
    dVar17 = polyfit(local_298,&mon_str_fac);
    pdVar10[0x26].str = (uint8_t)(int)dVar17;
    next_rank(consistent,&local_298,28.0,dVar16);
    dVar17 = polyfit(local_298,&mon_agi_fac);
    pdVar10[0x26].agi = (uint8_t)(int)dVar17;
    lVar9 = 0;
    uVar6 = mt_rand(0,0xff);
    pdVar10[0x26].pattern = (uint8_t)uVar6;
    pdVar10[0x26].s_ss_resist = pdVar10[0x26].s_ss_resist & 0xf0;
    dVar17 = mt_rand_double_ranged(38.0,40.0);
    dVar17 = polyfit((double)(float)dVar17,&mon_ssr_fac);
    pdVar10[0x26].s_ss_resist = pdVar10[0x26].s_ss_resist | (byte)(int)dVar17;
    pdVar10[0x26].rank = 39.9;
    uVar6 = mt_rand(0,0xff);
    bVar4 = (byte)uVar6 & 0xb0 | pdVar10[0x27].pattern;
    bVar5 = bVar4 & 0xcf;
    if ((~bVar4 & 0x30) != 0) {
      bVar5 = bVar4;
    }
    pdVar10[0x27].pattern = bVar5;
    pdVar10[0x27].s_ss_resist = pdVar10[0x27].s_ss_resist & 0xf0;
    dVar17 = mt_rand_double_ranged(38.0,40.0);
    dVar17 = polyfit((double)(float)dVar17,&mon_ssr_fac);
    pdVar10[0x27].s_ss_resist = pdVar10[0x27].s_ss_resist | (byte)(int)dVar17;
    uVar6 = mt_rand(100,0xe6);
    pdVar10[0x27].hp = (uint8_t)uVar6;
    pdVar10[0x27].rank = 40.0;
    for (; lVar9 != 0x26; lVar9 = lVar9 + 1) {
      rom->repel_table[lVar9] = pdVar10->str;
      pdVar10 = pdVar10 + 1;
    }
    pdVar10 = rom->enemies;
    lVar9 = 0;
    for (lVar8 = 0; lVar8 != 0x26; lVar8 = lVar8 + 1) {
      *(short *)((long)&pdVar10->index + lVar9) = (short)lVar8;
      puVar1 = &pdVar10->str + lVar9;
      uVar3 = *(undefined8 *)(puVar1 + 8);
      *(undefined8 *)((long)&local_298 + lVar9) = *(undefined8 *)puVar1;
      *(undefined8 *)(&stack0xfffffffffffffd70 + lVar9) = uVar3;
      lVar9 = lVar9 + 0x10;
    }
    qsort(&local_298,0x26,0x10,compare_enemies);
    lVar8 = 0;
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      uVar6 = 0xe;
      if (lVar9 == 0) {
        uVar6 = 7;
      }
      pdVar10 = (dw_enemy *)0x0;
      for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
        uVar7 = mt_rand(0,uVar6);
        rom->zones[lVar11 + lVar8] = (uint8_t)auStack_28a[(long)(int)uVar7 * 8];
        if ((pdVar10 == (dw_enemy *)0x0) ||
           (pfVar2 = &rom->enemies[auStack_28a[(long)(int)uVar7 * 8]].rank,
           *pfVar2 <= pdVar10->rank && pdVar10->rank != *pfVar2)) {
          pdVar10 = rom->enemies + auStack_28a[(long)(int)uVar7 * 8];
        }
      }
      bVar5 = pdVar10->hp;
      if (4 < bVar5) {
        bVar5 = 5;
      }
      pdVar10->hp = bVar5;
      bVar5 = pdVar10->str;
      if (9 < bVar5) {
        bVar5 = 10;
      }
      pdVar10->str = bVar5;
      pdVar10->pattern = '\0';
      dVar17 = mt_rand_double_ranged(1.0,25.0);
      dVar17 = polyfit(dVar17,&mon_xp_fac);
      pdVar10->xp = (ushort)(int)dVar17 & 0xff;
      pdVar10->rank = 1.0;
      lVar8 = lVar8 + 5;
    }
    lVar9 = 0x50;
    for (lVar8 = 0x10; lVar8 != 0x13; lVar8 = lVar8 + 1) {
      for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
        uVar6 = mt_rand(0x1b,0x24);
        rom->zones[lVar11 + lVar9] = (uint8_t)auStack_28a[uVar6 * 8];
      }
      lVar9 = lVar9 + 5;
    }
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      uVar6 = mt_rand(0x21,0x25);
      rom->spike_table->monster[lVar9] = (uint8_t)auStack_28a[uVar6 * 8];
    }
    for (lVar9 = 0; lVar9 != 5; lVar9 = lVar9 + 1) {
      uVar6 = mt_rand(0x15,0x20);
      rom->spike_table->monster[lVar9 + 3] = (uint8_t)auStack_28a[uVar6 * 8];
    }
    bVar5 = rom->flags[5];
  }
  if (((bVar5 & 0xc) != 0) || ((rom->flags[4] & 3) != 0)) {
    puts("Enabling alternate running algorithm...");
    vpatch(rom,0xee94,0x35,0xa5,0x45,0xc9,0x14,0x90,7,0xa5,0x95,0x29,0x7f,0x4c,199,0xee,0xc9,6,0x90,
           5,0xa5,0x95,0x4c,199,0xee,0xc9,2,0x90,0x12,0xa5,0x95,0x29,0x3f,0x85,0x3e,0x20,0x5b,0xc5,
           0xa5,0x95,0x29,0x1f,0x65,0x3e,0x4c,199,0xee,0x20,0x5b,0xc5,0xa5,0x95,0x29,0x3f,0x85,0x3c)
    ;
    bVar5 = rom->flags[5];
  }
  if ((bVar5 & 3) != 0) {
    pdVar10 = rom->enemies;
    iVar12 = 1;
    for (lVar9 = 10; lVar9 != 0x26a; lVar9 = lVar9 + 0x10) {
      if ((rom->flags[5] & 0xc) == 0) {
        dVar17 = (double)iVar12;
        fVar13 = *(float *)(&pdVar10->str + lVar9);
      }
      else {
        fVar13 = *(float *)(&pdVar10->str + lVar9);
        dVar17 = (double)fVar13;
      }
      local_298 = dVar17;
      if ((fVar13 != 1.0) || (NAN(fVar13))) {
        next_rank(rom->flags[6] & 0xffffffc0,&local_298,1.0,dVar17);
        dVar16 = polyfit(local_298,&mon_xp_fac);
        *(short *)((long)pdVar10 + lVar9 + -4) = (short)(int)dVar16;
      }
      next_rank(rom->flags[6] & 0xffffffc0,&local_298,1.0,dVar17);
      dVar17 = polyfit(local_298,&mon_gold_fac);
      *(short *)((long)pdVar10 + lVar9 + -2) = (short)(int)dVar17;
      iVar12 = iVar12 + 1;
    }
  }
  bVar5 = rom->flags[1];
  if ((bVar5 & 3) != 0) {
    for (lVar9 = 1; lVar9 != 0x1e; lVar9 = lVar9 + 1) {
      dVar17 = mt_rand_double_ranged(1.0,30.0);
      dVar17 = polyfit(dVar17,&hero_xp_fac);
      rom->xp_reqs[lVar9] = (uint16_t)(int)dVar17;
    }
    if ((rom->flags[0xd] & 0x10) == 0) {
      __base = rom->xp_reqs;
      if ((rom->flags[0xd] & 0x20) != 0) {
        for (lVar9 = 1; lVar9 != 0x1e; lVar9 = lVar9 + 1) {
          __base[lVar9] = __base[lVar9] >> 1;
        }
      }
    }
    else {
      __base = rom->xp_reqs;
      for (lVar9 = 1; lVar9 != 0x1e; lVar9 = lVar9 + 1) {
        __base[lVar9] = (uint16_t)(int)((double)__base[lVar9] * 3.0 * 0.25);
      }
    }
    qsort(__base,0x1e,2,compare_16);
    bVar5 = rom->flags[1];
  }
  if ((bVar5 & 0xc) != 0) {
    for (lVar9 = 0; lVar9 != 0x11; lVar9 = lVar9 + 1) {
      dVar17 = mt_rand_double_ranged(1.0,15.0);
      dVar17 = polyfit(dVar17,&wpn_price_fac);
      rom->weapon_prices[lVar9] = (uint16_t)(int)dVar17;
      rom->weapon_price_display[lVar9] = (uint16_t)(int)dVar17;
    }
  }
  return;
}

Assistant:

void chaos_mode(dw_rom *rom)
{
    if (RANDOM_ENEMY_STATS(rom)) {
        chaos_enemy_stats(rom);
        chaos_zones(rom);
    }

    chaos_running(rom);
    chaos_enemy_drops(rom);
    chaos_xp(rom);
    chaos_weapon_prices(rom);
}